

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastInt32ToBufferLeft(int32 i,char *buffer)

{
  char *pcVar1;
  char *in_RDX;
  undefined1 *in_RSI;
  uint in_EDI;
  uint32 u;
  uint local_14;
  undefined1 *local_10;
  
  local_14 = in_EDI;
  local_10 = in_RSI;
  if ((int)in_EDI < 0) {
    local_10 = in_RSI + 1;
    *in_RSI = 0x2d;
    local_14 = -in_EDI;
  }
  pcVar1 = FastUInt32ToBufferLeft((protobuf *)(ulong)local_14,(uint32)local_10,in_RDX);
  return pcVar1;
}

Assistant:

char* FastInt32ToBufferLeft(int32 i, char* buffer) {
  uint32 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt32ToBufferLeft(u, buffer);
}